

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void statPush(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  tRowcnt *ptVar1;
  uint uVar2;
  tRowcnt *ptVar3;
  tRowcnt *ptVar4;
  tRowcnt *ptVar5;
  sqlite3_value *pMem;
  sqlite3 *db;
  int iVar6;
  u32 uVar7;
  Stat4Accum *p;
  i64 iVar8;
  u8 *puVar9;
  ulong uVar10;
  long lVar11;
  Stat4Sample *pNew;
  uint iChng;
  long lVar12;
  
  p = (Stat4Accum *)sqlite3_value_blob(*argv);
  iVar8 = sqlite3VdbeIntValue(argv[1]);
  iChng = (uint)iVar8;
  if (p->nRow == 0) {
    if (0 < p->nCol) {
      ptVar3 = (p->current).anEq;
      lVar12 = 0;
      do {
        ptVar3[lVar12] = 1;
        lVar12 = lVar12 + 1;
      } while (lVar12 < p->nCol);
    }
  }
  else {
    samplePushPrevious(p,iChng);
    if (0 < (int)iChng) {
      ptVar3 = (p->current).anEq;
      uVar10 = 0;
      do {
        ptVar4 = ptVar3 + uVar10;
        *ptVar4 = *ptVar4 + 1;
        uVar10 = uVar10 + 1;
      } while ((iChng & 0x7fffffff) != uVar10);
    }
    if ((int)iChng < p->nCol) {
      ptVar3 = (p->current).anEq;
      ptVar4 = (p->current).anDLt;
      ptVar5 = (p->current).anLt;
      lVar12 = (long)(int)iChng;
      do {
        ptVar1 = ptVar4 + lVar12;
        *ptVar1 = *ptVar1 + 1;
        ptVar1 = ptVar5 + lVar12;
        *ptVar1 = *ptVar1 + ptVar3[lVar12];
        ptVar3[lVar12] = 1;
        lVar12 = lVar12 + 1;
      } while (lVar12 < p->nCol);
    }
  }
  p->nRow = p->nRow + 1;
  pMem = argv[2];
  uVar2._0_2_ = pMem->flags;
  uVar2._2_1_ = pMem->enc;
  uVar2._3_1_ = pMem->eSubtype;
  db = p->db;
  if ((0x50505050U >> (uVar2 & 0x1f) & 1) == 0) {
    iVar6 = sqlite3ValueBytes(pMem,'\x01');
    puVar9 = (u8 *)sqlite3_value_blob(argv[2]);
    sampleSetRowid(db,&p->current,iVar6,puVar9);
  }
  else {
    iVar8 = sqlite3VdbeIntValue(pMem);
    if (((p->current).nRowid != 0) && (puVar9 = (p->current).u.aRowid, puVar9 != (u8 *)0x0)) {
      sqlite3DbFreeNN(db,puVar9);
    }
    (p->current).nRowid = 0;
    (p->current).u.iRowid = iVar8;
  }
  uVar7 = p->iPrn * 0x41c64e6d + 0x3039;
  p->iPrn = uVar7;
  pNew = &p->current;
  (p->current).iHash = uVar7;
  iVar6 = p->nCol;
  uVar2 = (p->current).anLt[(long)iVar6 + -1];
  if (uVar2 / p->nPSample != (uVar2 + 1) / p->nPSample) {
    (p->current).isPSample = '\x01';
    (p->current).iCol = 0;
    sampleInsert(p,pNew,iVar6 + -1);
    (p->current).isPSample = '\0';
  }
  uVar10 = (ulong)(uint)p->nCol;
  if (1 < p->nCol) {
    lVar12 = 0;
    do {
      (p->current).iCol = (int)lVar12;
      if (lVar12 < (int)iChng) {
        lVar11 = (long)(p->current).iCol;
        do {
          lVar11 = lVar11 + 1;
          if ((int)uVar10 <= lVar11) {
            if (p->aBest[lVar12].iHash < (p->current).iHash) goto LAB_001a97fe;
            break;
          }
          uVar2 = p->aBest[lVar12].anEq[lVar11];
          if (uVar2 < pNew->anEq[lVar11]) goto LAB_001a97fe;
        } while (uVar2 <= pNew->anEq[lVar11]);
      }
      else {
LAB_001a97fe:
        sampleCopy(p,p->aBest + lVar12,pNew);
      }
      lVar12 = lVar12 + 1;
      uVar10 = (ulong)p->nCol;
    } while (lVar12 < (long)(uVar10 - 1));
  }
  return;
}

Assistant:

static void statPush(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i;

  /* The three function arguments */
  Stat4Accum *p = (Stat4Accum*)sqlite3_value_blob(argv[0]);
  int iChng = sqlite3_value_int(argv[1]);

  UNUSED_PARAMETER( argc );
  UNUSED_PARAMETER( context );
  assert( p->nCol>0 );
  assert( iChng<p->nCol );

  if( p->nRow==0 ){
    /* This is the first call to this function. Do initialization. */
    for(i=0; i<p->nCol; i++) p->current.anEq[i] = 1;
  }else{
    /* Second and subsequent calls get processed here */
    samplePushPrevious(p, iChng);

    /* Update anDLt[], anLt[] and anEq[] to reflect the values that apply
    ** to the current row of the index. */
    for(i=0; i<iChng; i++){
      p->current.anEq[i]++;
    }
    for(i=iChng; i<p->nCol; i++){
      p->current.anDLt[i]++;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
      p->current.anLt[i] += p->current.anEq[i];
#endif
      p->current.anEq[i] = 1;
    }
  }
  p->nRow++;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( sqlite3_value_type(argv[2])==SQLITE_INTEGER ){
    sampleSetRowidInt64(p->db, &p->current, sqlite3_value_int64(argv[2]));
  }else{
    sampleSetRowid(p->db, &p->current, sqlite3_value_bytes(argv[2]),
                                       sqlite3_value_blob(argv[2]));
  }
  p->current.iHash = p->iPrn = p->iPrn*1103515245 + 12345;
#endif

#ifdef SQLITE_ENABLE_STAT4
  {
    tRowcnt nLt = p->current.anLt[p->nCol-1];

    /* Check if this is to be a periodic sample. If so, add it. */
    if( (nLt/p->nPSample)!=(nLt+1)/p->nPSample ){
      p->current.isPSample = 1;
      p->current.iCol = 0;
      sampleInsert(p, &p->current, p->nCol-1);
      p->current.isPSample = 0;
    }

    /* Update the aBest[] array. */
    for(i=0; i<(p->nCol-1); i++){
      p->current.iCol = i;
      if( i>=iChng || sampleIsBetterPost(p, &p->current, &p->aBest[i]) ){
        sampleCopy(p, &p->aBest[i], &p->current);
      }
    }
  }
#endif
}